

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

reference __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
::iterator::operator*(iterator *this)

{
  ctrl_t *pcVar1;
  FieldDescriptor *pFVar2;
  FieldDescriptor *pFVar3;
  FieldDescriptor *pFVar4;
  long lVar5;
  FieldDescriptor *pFVar6;
  FieldDescriptor *pFVar7;
  bool bVar8;
  FieldDescriptor *pFVar9;
  ulong uVar10;
  pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*> *in_RSI;
  iterator iVar11;
  
  pcVar1 = this->ctrl_;
  if (pcVar1 == (ctrl_t *)0x0) {
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
    ::iterator::operator*((iterator *)this);
LAB_0048ed77:
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
    ::iterator::operator*((iterator *)this);
  }
  else {
    if (pcVar1 == kEmptyGroup + 0x10) goto LAB_0048ed77;
    if (kSentinel < *pcVar1) {
      return (this->field_1).slot_;
    }
  }
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
  ::iterator::operator*((iterator *)this);
  pFVar2 = *(FieldDescriptor **)this;
  if ((pFVar2 == (FieldDescriptor *)(kEmptyGroup + 0x10) || pFVar2 == (FieldDescriptor *)0x0) ||
     (-1 < *(char *)&((MessageLite *)&pFVar2->super_SymbolBase)->_vptr_MessageLite)) {
    pFVar3 = (FieldDescriptor *)in_RSI->first;
    if ((pFVar3 != (FieldDescriptor *)(kEmptyGroup + 0x10) && pFVar3 != (FieldDescriptor *)0x0) &&
       (*(char *)&((MessageLite *)&pFVar3->super_SymbolBase)->_vptr_MessageLite < '\0'))
    goto LAB_0048ee70;
    if (pFVar2 == (FieldDescriptor *)(kEmptyGroup + 0x10) &&
        pFVar3 == (FieldDescriptor *)(kEmptyGroup + 0x10)) {
LAB_0048ee63:
      return (reference)CONCAT71((int7)((ulong)pFVar2 >> 8),pFVar2 == pFVar3);
    }
    if ((pFVar2 == (FieldDescriptor *)(kEmptyGroup + 0x10)) ==
        (pFVar3 == (FieldDescriptor *)(kEmptyGroup + 0x10))) {
      if (pFVar2 == (FieldDescriptor *)0x0 || pFVar3 == (FieldDescriptor *)0x0) goto LAB_0048ee63;
      if ((pFVar3 == (FieldDescriptor *)kSooControl) == (pFVar2 == (FieldDescriptor *)kSooControl))
      {
        this = (iterator *)(((FieldDescriptor *)this)->all_names_).payload_;
        pFVar4 = in_RSI->second;
        if (pFVar2 == (FieldDescriptor *)kSooControl) {
          bVar8 = (FieldDescriptor *)this == pFVar4;
        }
        else {
          pFVar9 = pFVar4;
          pFVar6 = pFVar3;
          pFVar7 = (FieldDescriptor *)this;
          if (pFVar3 < pFVar2) {
            pFVar9 = (FieldDescriptor *)this;
            pFVar6 = pFVar2;
            pFVar7 = pFVar4;
          }
          in_RSI = (pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                    *)CONCAT71((int7)((ulong)pFVar6 >> 8),pFVar6 < pFVar7);
          bVar8 = pFVar7 <= pFVar9 && pFVar6 < pFVar7;
        }
        if (bVar8) goto LAB_0048ee63;
      }
      goto LAB_0048ee7a;
    }
  }
  else {
    container_internal::operator==();
LAB_0048ee70:
    container_internal::operator==();
  }
  container_internal::operator==();
LAB_0048ee7a:
  container_internal::operator==();
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
  ::
  AssertHashEqConsistent<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
              *)this,in_RSI);
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
              *)this);
  lVar5._0_1_ = ((FieldDescriptor *)this)->super_SymbolBase;
  lVar5._1_1_ = ((FieldDescriptor *)this)->field_0x1;
  lVar5._2_1_ = ((FieldDescriptor *)this)->type_;
  lVar5._3_1_ = ((FieldDescriptor *)this)->field_0x3;
  lVar5._4_4_ = ((FieldDescriptor *)this)->number_;
  if (lVar5 == 1) {
    iVar11 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
             ::
             find_soo<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>
                       ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
                         *)this,in_RSI);
    return (reference)iVar11.ctrl_;
  }
  if (lVar5 == 0) {
    __assert_fail("cap >= kDefaultCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb75,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Hash = absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Eq = std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Alloc = std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>]"
                 );
  }
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
  ::prefetch_heap_block
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
              *)this);
  uVar10 = ((ulong)in_RSI->first ^ 0x853410) * -0x234dd359734ecb13;
  uVar10 = ((uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
             (uVar10 & 0xff0000000000) >> 0x18 | (uVar10 & 0xff00000000) >> 8 |
             (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 | (uVar10 & 0xff00) << 0x28 |
            uVar10 << 0x38) ^ (ulong)in_RSI->first) * -0x234dd359734ecb13;
  uVar10 = ((uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
             (uVar10 & 0xff0000000000) >> 0x18 | (uVar10 & 0xff00000000) >> 8 |
             (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 | (uVar10 & 0xff00) << 0x28 |
            uVar10 << 0x38) ^ (ulong)in_RSI->second) * -0x234dd359734ecb13;
  uVar10 = ((uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
             (uVar10 & 0xff0000000000) >> 0x18 | (uVar10 & 0xff00000000) >> 8 |
             (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 | (uVar10 & 0xff00) << 0x28 |
            uVar10 << 0x38) ^ (ulong)in_RSI->second) * -0x234dd359734ecb13;
  iVar11 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
           ::
           find_non_soo<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>
                     ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
                       *)this,in_RSI,
                      uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
                      (uVar10 & 0xff0000000000) >> 0x18 | (uVar10 & 0xff00000000) >> 8 |
                      (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 |
                      (uVar10 & 0xff00) << 0x28 | uVar10 << 0x38);
  return (reference)iVar11.ctrl_;
}

Assistant:

reference operator*() const {
      AssertIsFull(ctrl_, generation(), generation_ptr(), "operator*()");
      return unchecked_deref();
    }